

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

void json_print_templates(json_session *session,abuf_template_data *data,size_t count)

{
  autobuf *autobuf;
  ulong uVar1;
  abuf_template_data_entry *paVar2;
  bool bVar3;
  abuf_template_data *paVar4;
  char *s;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  if (session->empty == true) {
    session->empty = false;
    s = "\n";
  }
  else {
    s = ",\n";
  }
  abuf_puts(session->out,s);
  if (count != 0) {
    autobuf = session->out;
    bVar3 = true;
    sVar7 = 0;
    do {
      uVar1 = data[sVar7].count;
      if (uVar1 != 0) {
        paVar4 = data + sVar7;
        lVar6 = 0;
        uVar5 = 0;
        do {
          paVar2 = paVar4->data;
          if (*(long *)((long)&paVar2->value + lVar6) != 0) {
            if (!bVar3) {
              abuf_puts(autobuf,",\n");
              paVar2 = paVar4->data;
            }
            bVar3 = false;
            abuf_appendf(autobuf,"\"%s\":",*(undefined8 *)((long)&paVar2->key + lVar6));
            _json_printvalue(autobuf,*(char **)((long)&paVar4->data->value + lVar6),
                             (&paVar4->data->string)[lVar6]);
            uVar1 = paVar4->count;
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x18;
        } while (uVar5 < uVar1);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != count);
  }
  return;
}

Assistant:

void
json_print_templates(struct json_session *session, struct abuf_template_data *data, size_t count) {
  if (session->empty) {
    session->empty = false;
    abuf_puts(session->out, "\n");
  }
  else {
    abuf_puts(session->out, ",\n");
  }

  _add_template(session->out, false, data, count);
}